

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestJson.cpp
# Opt level: O3

void testJson(void)

{
  usize *puVar1;
  Data *pDVar2;
  Data *pDVar3;
  Data *pDVar4;
  usize count;
  code *pcVar5;
  bool bVar6;
  int iVar7;
  HashMap<String,_Variant> *pHVar8;
  Iterator IVar9;
  String *pSVar10;
  List<Variant> *pLVar11;
  Variant data;
  Parser parser;
  String surrogatePairCheck;
  String input;
  String local_120;
  String local_f8;
  String local_d0;
  Variant local_a8;
  Parser local_88;
  String local_80;
  String local_58;
  
  Json::Parser::Parser(&local_88);
  local_a8.data = &Variant::nullData.super_Data;
  local_58.data = &local_58._data;
  local_58._data.ref = 0;
  local_58._data.str =
       "{\n  \"title\": \"Example Schema\",\n  \"surrogatePair\": \"aa\\uD834\\uDD1Ebb\",\n  \"type\": \"object\",\n  \"properties\": {\n    \"firstName\": {\n      \"type\": \"string\"\n    },\n    \"lastName\": {\n      \"type\": \"string\"\n    },\n    \"age\": {\n      \"description\": \"Age in years\",\n      \"type\": \"integer\",\n      \"minimum\": 0\n    }\n  },\n  \"required\": [\"firstName\", \"lastName\"]\n}\n"
  ;
  local_58._data.len = 0x160;
  bVar6 = Json::Parser::parse(&local_88,&local_58,&local_a8);
  if (!bVar6) {
    iVar7 = Debug::printf("%s:%u: assertion failed: %s\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestJson.cpp"
                          ,0x1d,"parser.parse(input, data)");
    if (iVar7 != 0) goto LAB_00103772;
  }
  pHVar8 = Variant::toMap(&local_a8);
  local_80.data = &local_80._data;
  local_80._data.ref = 0;
  local_80._data.str = "title";
  local_80._data.len = 5;
  IVar9 = HashMap<String,_Variant>::find(pHVar8,&local_80);
  pSVar10 = Variant::toString(&(IVar9.item)->value);
  if (pSVar10->data->len == 0xe) {
    iVar7 = Memory::compare(pSVar10->data->str,"Example Schema",0xe);
    if (iVar7 != 0) goto LAB_00102b43;
  }
  else {
LAB_00102b43:
    iVar7 = Debug::printf("%s:%u: assertion failed: %s\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestJson.cpp"
                          ,0x1e,"data.toMap().find(\"title\")->toString() == \"Example Schema\"");
    if (iVar7 != 0) goto LAB_00103772;
  }
  if ((local_80.data)->ref != 0) {
    LOCK();
    puVar1 = &(local_80.data)->ref;
    *puVar1 = *puVar1 - 1;
    UNLOCK();
    if ((*puVar1 == 0) && (local_80.data != (Data *)0x0)) {
      operator_delete__(local_80.data);
    }
  }
  local_80.data = &String::emptyData.super_Data;
  pDVar2 = &local_120._data;
  local_120._data.ref = 0;
  local_120._data.str = "aa";
  local_120._data.len = 2;
  local_120.data = pDVar2;
  String::append(&local_80,&local_120);
  if ((local_120.data)->ref != 0) {
    LOCK();
    puVar1 = &(local_120.data)->ref;
    *puVar1 = *puVar1 - 1;
    UNLOCK();
    if ((*puVar1 == 0) && (local_120.data != (Data *)0x0)) {
      operator_delete__(local_120.data);
    }
  }
  Unicode::append(0x1d11e,&local_80);
  local_120._data.ref = 0;
  local_120._data.str = "bb";
  local_120._data.len = 2;
  local_120.data = pDVar2;
  String::append(&local_80,&local_120);
  if ((local_120.data)->ref != 0) {
    LOCK();
    puVar1 = &(local_120.data)->ref;
    *puVar1 = *puVar1 - 1;
    UNLOCK();
    if ((*puVar1 == 0) && (local_120.data != (Data *)0x0)) {
      operator_delete__(local_120.data);
    }
  }
  pHVar8 = Variant::toMap(&local_a8);
  local_120._data.ref = 0;
  local_120._data.str = "surrogatePair";
  local_120._data.len = 0xd;
  local_120.data = pDVar2;
  IVar9 = HashMap<String,_Variant>::find(pHVar8,&local_120);
  pSVar10 = Variant::toString(&(IVar9.item)->value);
  count = pSVar10->data->len;
  if (count == (local_80.data)->len) {
    iVar7 = Memory::compare(pSVar10->data->str,(local_80.data)->str,count);
    if (iVar7 != 0) goto LAB_00102cc1;
  }
  else {
LAB_00102cc1:
    iVar7 = Debug::printf("%s:%u: assertion failed: %s\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestJson.cpp"
                          ,0x23,
                          "data.toMap().find(\"surrogatePair\")->toString() == surrogatePairCheck");
    if (iVar7 != 0) goto LAB_00103772;
  }
  if ((local_120.data)->ref != 0) {
    LOCK();
    puVar1 = &(local_120.data)->ref;
    *puVar1 = *puVar1 - 1;
    UNLOCK();
    if ((*puVar1 == 0) && (local_120.data != (Data *)0x0)) {
      operator_delete__(local_120.data);
    }
  }
  pHVar8 = Variant::toMap(&local_a8);
  local_120._data.ref = 0;
  local_120._data.str = "type";
  local_120._data.len = 4;
  local_120.data = pDVar2;
  IVar9 = HashMap<String,_Variant>::find(pHVar8,&local_120);
  pSVar10 = Variant::toString(&(IVar9.item)->value);
  if (pSVar10->data->len == 6) {
    iVar7 = Memory::compare(pSVar10->data->str,"object",6);
    if (iVar7 != 0) goto LAB_00102d72;
  }
  else {
LAB_00102d72:
    iVar7 = Debug::printf("%s:%u: assertion failed: %s\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestJson.cpp"
                          ,0x24,"data.toMap().find(\"type\")->toString() == \"object\"");
    if (iVar7 != 0) goto LAB_00103772;
  }
  if ((local_120.data)->ref != 0) {
    LOCK();
    puVar1 = &(local_120.data)->ref;
    *puVar1 = *puVar1 - 1;
    UNLOCK();
    if ((*puVar1 == 0) && (local_120.data != (Data *)0x0)) {
      operator_delete__(local_120.data);
    }
  }
  pHVar8 = Variant::toMap(&local_a8);
  local_120._data.ref = 0;
  local_120._data.str = "properties";
  local_120._data.len = 10;
  local_120.data = pDVar2;
  IVar9 = HashMap<String,_Variant>::find(pHVar8,&local_120);
  pHVar8 = Variant::toMap(&(IVar9.item)->value);
  pDVar3 = &local_d0._data;
  local_d0._data.ref = 0;
  local_d0._data.str = "firstName";
  local_d0._data.len = 9;
  local_d0.data = pDVar3;
  IVar9 = HashMap<String,_Variant>::find(pHVar8,&local_d0);
  pHVar8 = Variant::toMap(&(IVar9.item)->value);
  pDVar4 = &local_f8._data;
  local_f8._data.ref = 0;
  local_f8._data.str = "type";
  local_f8._data.len = 4;
  local_f8.data = pDVar4;
  IVar9 = HashMap<String,_Variant>::find(pHVar8,&local_f8);
  pSVar10 = Variant::toString(&(IVar9.item)->value);
  if (pSVar10->data->len == 6) {
    iVar7 = Memory::compare(pSVar10->data->str,"string",6);
    if (iVar7 != 0) goto LAB_00102e98;
  }
  else {
LAB_00102e98:
    iVar7 = Debug::printf("%s:%u: assertion failed: %s\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestJson.cpp"
                          ,0x25,
                          "data.toMap().find(\"properties\")->toMap().find(\"firstName\")->toMap().find(\"type\")->toString() == \"string\""
                         );
    if (iVar7 != 0) goto LAB_00103772;
  }
  if ((local_f8.data)->ref != 0) {
    LOCK();
    puVar1 = &(local_f8.data)->ref;
    *puVar1 = *puVar1 - 1;
    UNLOCK();
    if ((*puVar1 == 0) && (local_f8.data != (Data *)0x0)) {
      operator_delete__(local_f8.data);
    }
  }
  if ((local_d0.data)->ref != 0) {
    LOCK();
    puVar1 = &(local_d0.data)->ref;
    *puVar1 = *puVar1 - 1;
    UNLOCK();
    if ((*puVar1 == 0) && (local_d0.data != (Data *)0x0)) {
      operator_delete__(local_d0.data);
    }
  }
  if ((local_120.data)->ref != 0) {
    LOCK();
    puVar1 = &(local_120.data)->ref;
    *puVar1 = *puVar1 - 1;
    UNLOCK();
    if ((*puVar1 == 0) && (local_120.data != (Data *)0x0)) {
      operator_delete__(local_120.data);
    }
  }
  pHVar8 = Variant::toMap(&local_a8);
  local_120._data.ref = 0;
  local_120._data.str = "properties";
  local_120._data.len = 10;
  local_120.data = pDVar2;
  IVar9 = HashMap<String,_Variant>::find(pHVar8,&local_120);
  pHVar8 = Variant::toMap(&(IVar9.item)->value);
  local_d0._data.ref = 0;
  local_d0._data.str = "lastName";
  local_d0._data.len = 8;
  local_d0.data = pDVar3;
  IVar9 = HashMap<String,_Variant>::find(pHVar8,&local_d0);
  pHVar8 = Variant::toMap(&(IVar9.item)->value);
  local_f8._data.ref = 0;
  local_f8._data.str = "type";
  local_f8._data.len = 4;
  local_f8.data = pDVar4;
  IVar9 = HashMap<String,_Variant>::find(pHVar8,&local_f8);
  pSVar10 = Variant::toString(&(IVar9.item)->value);
  if (pSVar10->data->len == 6) {
    iVar7 = Memory::compare(pSVar10->data->str,"string",6);
    if (iVar7 != 0) goto LAB_00102fed;
  }
  else {
LAB_00102fed:
    iVar7 = Debug::printf("%s:%u: assertion failed: %s\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestJson.cpp"
                          ,0x26,
                          "data.toMap().find(\"properties\")->toMap().find(\"lastName\")->toMap().find(\"type\")->toString() == \"string\""
                         );
    if (iVar7 != 0) goto LAB_00103772;
  }
  if ((local_f8.data)->ref != 0) {
    LOCK();
    puVar1 = &(local_f8.data)->ref;
    *puVar1 = *puVar1 - 1;
    UNLOCK();
    if ((*puVar1 == 0) && (local_f8.data != (Data *)0x0)) {
      operator_delete__(local_f8.data);
    }
  }
  if ((local_d0.data)->ref != 0) {
    LOCK();
    puVar1 = &(local_d0.data)->ref;
    *puVar1 = *puVar1 - 1;
    UNLOCK();
    if ((*puVar1 == 0) && (local_d0.data != (Data *)0x0)) {
      operator_delete__(local_d0.data);
    }
  }
  if ((local_120.data)->ref != 0) {
    LOCK();
    puVar1 = &(local_120.data)->ref;
    *puVar1 = *puVar1 - 1;
    UNLOCK();
    if ((*puVar1 == 0) && (local_120.data != (Data *)0x0)) {
      operator_delete__(local_120.data);
    }
  }
  pHVar8 = Variant::toMap(&local_a8);
  local_120._data.ref = 0;
  local_120._data.str = "properties";
  local_120._data.len = 10;
  local_120.data = pDVar2;
  IVar9 = HashMap<String,_Variant>::find(pHVar8,&local_120);
  pHVar8 = Variant::toMap(&(IVar9.item)->value);
  local_d0._data.ref = 0;
  local_d0._data.str = "age";
  local_d0._data.len = 3;
  local_d0.data = pDVar3;
  IVar9 = HashMap<String,_Variant>::find(pHVar8,&local_d0);
  pHVar8 = Variant::toMap(&(IVar9.item)->value);
  local_f8._data.ref = 0;
  local_f8._data.str = "description";
  local_f8._data.len = 0xb;
  local_f8.data = pDVar4;
  IVar9 = HashMap<String,_Variant>::find(pHVar8,&local_f8);
  pSVar10 = Variant::toString(&(IVar9.item)->value);
  if (pSVar10->data->len == 0xc) {
    iVar7 = Memory::compare(pSVar10->data->str,"Age in years",0xc);
    if (iVar7 != 0) goto LAB_00103149;
  }
  else {
LAB_00103149:
    iVar7 = Debug::printf("%s:%u: assertion failed: %s\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestJson.cpp"
                          ,0x27,
                          "data.toMap().find(\"properties\")->toMap().find(\"age\")->toMap().find(\"description\")->toString() == \"Age in years\""
                         );
    if (iVar7 != 0) goto LAB_00103772;
  }
  if ((local_f8.data)->ref != 0) {
    LOCK();
    puVar1 = &(local_f8.data)->ref;
    *puVar1 = *puVar1 - 1;
    UNLOCK();
    if ((*puVar1 == 0) && (local_f8.data != (Data *)0x0)) {
      operator_delete__(local_f8.data);
    }
  }
  if ((local_d0.data)->ref != 0) {
    LOCK();
    puVar1 = &(local_d0.data)->ref;
    *puVar1 = *puVar1 - 1;
    UNLOCK();
    if ((*puVar1 == 0) && (local_d0.data != (Data *)0x0)) {
      operator_delete__(local_d0.data);
    }
  }
  if ((local_120.data)->ref != 0) {
    LOCK();
    puVar1 = &(local_120.data)->ref;
    *puVar1 = *puVar1 - 1;
    UNLOCK();
    if ((*puVar1 == 0) && (local_120.data != (Data *)0x0)) {
      operator_delete__(local_120.data);
    }
  }
  pHVar8 = Variant::toMap(&local_a8);
  local_120._data.ref = 0;
  local_120._data.str = "properties";
  local_120._data.len = 10;
  local_120.data = pDVar2;
  IVar9 = HashMap<String,_Variant>::find(pHVar8,&local_120);
  pHVar8 = Variant::toMap(&(IVar9.item)->value);
  local_d0._data.ref = 0;
  local_d0._data.str = "age";
  local_d0._data.len = 3;
  local_d0.data = pDVar3;
  IVar9 = HashMap<String,_Variant>::find(pHVar8,&local_d0);
  pHVar8 = Variant::toMap(&(IVar9.item)->value);
  local_f8._data.ref = 0;
  local_f8._data.str = "type";
  local_f8._data.len = 4;
  local_f8.data = pDVar4;
  IVar9 = HashMap<String,_Variant>::find(pHVar8,&local_f8);
  pSVar10 = Variant::toString(&(IVar9.item)->value);
  if (pSVar10->data->len == 7) {
    iVar7 = Memory::compare(pSVar10->data->str,"integer",7);
    if (iVar7 != 0) goto LAB_00103297;
  }
  else {
LAB_00103297:
    iVar7 = Debug::printf("%s:%u: assertion failed: %s\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestJson.cpp"
                          ,0x28,
                          "data.toMap().find(\"properties\")->toMap().find(\"age\")->toMap().find(\"type\")->toString() == \"integer\""
                         );
    if (iVar7 != 0) goto LAB_00103772;
  }
  if ((local_f8.data)->ref != 0) {
    LOCK();
    puVar1 = &(local_f8.data)->ref;
    *puVar1 = *puVar1 - 1;
    UNLOCK();
    if ((*puVar1 == 0) && (local_f8.data != (Data *)0x0)) {
      operator_delete__(local_f8.data);
    }
  }
  if ((local_d0.data)->ref != 0) {
    LOCK();
    puVar1 = &(local_d0.data)->ref;
    *puVar1 = *puVar1 - 1;
    UNLOCK();
    if ((*puVar1 == 0) && (local_d0.data != (Data *)0x0)) {
      operator_delete__(local_d0.data);
    }
  }
  if ((local_120.data)->ref != 0) {
    LOCK();
    puVar1 = &(local_120.data)->ref;
    *puVar1 = *puVar1 - 1;
    UNLOCK();
    if ((*puVar1 == 0) && (local_120.data != (Data *)0x0)) {
      operator_delete__(local_120.data);
    }
  }
  pHVar8 = Variant::toMap(&local_a8);
  local_120._data.ref = 0;
  local_120._data.str = "properties";
  local_120._data.len = 10;
  local_120.data = pDVar2;
  IVar9 = HashMap<String,_Variant>::find(pHVar8,&local_120);
  pHVar8 = Variant::toMap(&(IVar9.item)->value);
  local_d0._data.ref = 0;
  local_d0._data.str = "age";
  local_d0._data.len = 3;
  local_d0.data = pDVar3;
  IVar9 = HashMap<String,_Variant>::find(pHVar8,&local_d0);
  pHVar8 = Variant::toMap(&(IVar9.item)->value);
  local_f8._data.ref = 0;
  local_f8._data.str = "minimum";
  local_f8._data.len = 7;
  local_f8.data = pDVar4;
  IVar9 = HashMap<String,_Variant>::find(pHVar8,&local_f8);
  if ((((IVar9.item)->value).data)->type != intType) {
    iVar7 = Debug::printf("%s:%u: assertion failed: %s\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestJson.cpp"
                          ,0x29,
                          "data.toMap().find(\"properties\")->toMap().find(\"age\")->toMap().find(\"minimum\")->getType() == Variant::intType"
                         );
    if (iVar7 != 0) goto LAB_00103772;
  }
  if ((local_f8.data)->ref != 0) {
    LOCK();
    puVar1 = &(local_f8.data)->ref;
    *puVar1 = *puVar1 - 1;
    UNLOCK();
    if ((*puVar1 == 0) && (local_f8.data != (Data *)0x0)) {
      operator_delete__(local_f8.data);
    }
  }
  if ((local_d0.data)->ref != 0) {
    LOCK();
    puVar1 = &(local_d0.data)->ref;
    *puVar1 = *puVar1 - 1;
    UNLOCK();
    if ((*puVar1 == 0) && (local_d0.data != (Data *)0x0)) {
      operator_delete__(local_d0.data);
    }
  }
  if ((local_120.data)->ref != 0) {
    LOCK();
    puVar1 = &(local_120.data)->ref;
    *puVar1 = *puVar1 - 1;
    UNLOCK();
    if ((*puVar1 == 0) && (local_120.data != (Data *)0x0)) {
      operator_delete__(local_120.data);
    }
  }
  pHVar8 = Variant::toMap(&local_a8);
  local_120._data.ref = 0;
  local_120._data.str = "properties";
  local_120._data.len = 10;
  local_120.data = pDVar2;
  IVar9 = HashMap<String,_Variant>::find(pHVar8,&local_120);
  pHVar8 = Variant::toMap(&(IVar9.item)->value);
  local_d0._data.ref = 0;
  local_d0._data.str = "age";
  local_d0._data.len = 3;
  local_d0.data = pDVar3;
  IVar9 = HashMap<String,_Variant>::find(pHVar8,&local_d0);
  pHVar8 = Variant::toMap(&(IVar9.item)->value);
  local_f8._data.ref = 0;
  local_f8._data.str = "minimum";
  local_f8._data.len = 7;
  local_f8.data = pDVar4;
  IVar9 = HashMap<String,_Variant>::find(pHVar8,&local_f8);
  iVar7 = Variant::toInt(&(IVar9.item)->value);
  if (iVar7 != 0) {
    iVar7 = Debug::printf("%s:%u: assertion failed: %s\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestJson.cpp"
                          ,0x2a,
                          "data.toMap().find(\"properties\")->toMap().find(\"age\")->toMap().find(\"minimum\")->toInt() == 0"
                         );
    if (iVar7 != 0) goto LAB_00103772;
  }
  if ((local_f8.data)->ref != 0) {
    LOCK();
    puVar1 = &(local_f8.data)->ref;
    *puVar1 = *puVar1 - 1;
    UNLOCK();
    if ((*puVar1 == 0) && (local_f8.data != (Data *)0x0)) {
      operator_delete__(local_f8.data);
    }
  }
  if ((local_d0.data)->ref != 0) {
    LOCK();
    puVar1 = &(local_d0.data)->ref;
    *puVar1 = *puVar1 - 1;
    UNLOCK();
    if ((*puVar1 == 0) && (local_d0.data != (Data *)0x0)) {
      operator_delete__(local_d0.data);
    }
  }
  if ((local_120.data)->ref != 0) {
    LOCK();
    puVar1 = &(local_120.data)->ref;
    *puVar1 = *puVar1 - 1;
    UNLOCK();
    if ((*puVar1 == 0) && (local_120.data != (Data *)0x0)) {
      operator_delete__(local_120.data);
    }
  }
  pHVar8 = Variant::toMap(&local_a8);
  local_120._data.ref = 0;
  local_120._data.str = "required";
  local_120._data.len = 8;
  local_120.data = pDVar2;
  IVar9 = HashMap<String,_Variant>::find(pHVar8,&local_120);
  pLVar11 = Variant::toList(&(IVar9.item)->value);
  pSVar10 = Variant::toString(&((pLVar11->_begin).item)->value);
  if (pSVar10->data->len == 9) {
    iVar7 = Memory::compare(pSVar10->data->str,"firstName",9);
    if (iVar7 != 0) goto LAB_001035f5;
  }
  else {
LAB_001035f5:
    iVar7 = Debug::printf("%s:%u: assertion failed: %s\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestJson.cpp"
                          ,0x2b,
                          "data.toMap().find(\"required\")->toList().front().toString() == \"firstName\""
                         );
    if (iVar7 != 0) goto LAB_00103772;
  }
  if ((local_120.data)->ref != 0) {
    LOCK();
    puVar1 = &(local_120.data)->ref;
    *puVar1 = *puVar1 - 1;
    UNLOCK();
    if ((*puVar1 == 0) && (local_120.data != (Data *)0x0)) {
      operator_delete__(local_120.data);
    }
  }
  pHVar8 = Variant::toMap(&local_a8);
  local_120._data.ref = 0;
  local_120._data.str = "required";
  local_120._data.len = 8;
  local_120.data = pDVar2;
  IVar9 = HashMap<String,_Variant>::find(pHVar8,&local_120);
  pLVar11 = Variant::toList(&(IVar9.item)->value);
  pSVar10 = Variant::toString(&((pLVar11->_end).item)->prev->value);
  if (pSVar10->data->len == 8) {
    iVar7 = Memory::compare(pSVar10->data->str,"lastName",8);
    if (iVar7 == 0) goto LAB_001036d4;
  }
  iVar7 = Debug::printf("%s:%u: assertion failed: %s\n",
                        "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestJson.cpp"
                        ,0x2c,
                        "data.toMap().find(\"required\")->toList().back().toString() == \"lastName\""
                       );
  if (iVar7 != 0) {
LAB_00103772:
    pcVar5 = (code *)invalidInstructionException();
    (*pcVar5)();
  }
LAB_001036d4:
  if ((local_120.data)->ref != 0) {
    LOCK();
    puVar1 = &(local_120.data)->ref;
    *puVar1 = *puVar1 - 1;
    UNLOCK();
    if ((*puVar1 == 0) && (local_120.data != (Data *)0x0)) {
      operator_delete__(local_120.data);
    }
  }
  if ((local_80.data)->ref != 0) {
    LOCK();
    puVar1 = &(local_80.data)->ref;
    *puVar1 = *puVar1 - 1;
    UNLOCK();
    if ((*puVar1 == 0) && (local_80.data != (Data *)0x0)) {
      operator_delete__(local_80.data);
    }
  }
  if ((local_58.data)->ref != 0) {
    LOCK();
    puVar1 = &(local_58.data)->ref;
    *puVar1 = *puVar1 - 1;
    UNLOCK();
    if ((*puVar1 == 0) && (local_58.data != (Data *)0x0)) {
      operator_delete__(local_58.data);
    }
  }
  Variant::clear(&local_a8);
  Json::Parser::~Parser(&local_88);
  return;
}

Assistant:

void testJson()
{
  Json::Parser parser;
  Variant data;
  String input("{\n"
"  \"title\": \"Example Schema\",\n"
"  \"surrogatePair\": \"aa\\uD834\\uDD1Ebb\",\n"
"  \"type\": \"object\",\n"
"  \"properties\": {\n"
"    \"firstName\": {\n"
"      \"type\": \"string\"\n"
"    },\n"
"    \"lastName\": {\n"
"      \"type\": \"string\"\n"
"    },\n"
"    \"age\": {\n"
"      \"description\": \"Age in years\",\n"
"      \"type\": \"integer\",\n"
"      \"minimum\": 0\n"
"    }\n"
"  },\n"
"  \"required\": [\"firstName\", \"lastName\"]\n"
"}\n");
  ASSERT(parser.parse(input, data));
  ASSERT(data.toMap().find("title")->toString() == "Example Schema");
  String surrogatePairCheck;
  surrogatePairCheck.append("aa");
  Unicode::append(0x1d11e, surrogatePairCheck);
  surrogatePairCheck.append("bb");
  ASSERT(data.toMap().find("surrogatePair")->toString() == surrogatePairCheck);
  ASSERT(data.toMap().find("type")->toString() ==  "object");
  ASSERT(data.toMap().find("properties")->toMap().find("firstName")->toMap().find("type")->toString() == "string");
  ASSERT(data.toMap().find("properties")->toMap().find("lastName")->toMap().find("type")->toString() == "string");
  ASSERT(data.toMap().find("properties")->toMap().find("age")->toMap().find("description")->toString() == "Age in years");
  ASSERT(data.toMap().find("properties")->toMap().find("age")->toMap().find("type")->toString() == "integer");
  ASSERT(data.toMap().find("properties")->toMap().find("age")->toMap().find("minimum")->getType() == Variant::intType);
  ASSERT(data.toMap().find("properties")->toMap().find("age")->toMap().find("minimum")->toInt() == 0);
  ASSERT(data.toMap().find("required")->toList().front().toString() == "firstName");
  ASSERT(data.toMap().find("required")->toList().back().toString() == "lastName");
}